

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void test_comparison_operators(void)

{
  undefined1 local_330 [8];
  json s3;
  json s2;
  json s1;
  json d3;
  json d2;
  json d1;
  json i3;
  undefined1 local_b8 [8];
  json i2;
  json i1;
  
  argo::json::json((json *)&i2.field_0x50,1);
  argo::json::json((json *)local_b8,1);
  argo::json::json((json *)&d1.field_0x50,2);
  std::operator<<((ostream *)jlog,"testing int comparisons\n");
  test_comparison_operators_same((json *)&i2.field_0x50,(json *)local_b8,(json *)&d1.field_0x50);
  argo::json::json((json *)&d2.field_0x50,1.0);
  argo::json::json((json *)&d3.field_0x50,1.0);
  argo::json::json((json *)&s1.field_0x50,2.0);
  std::operator<<((ostream *)jlog,"testing double comparisons\n");
  test_comparison_operators_same
            ((json *)&d2.field_0x50,(json *)&d3.field_0x50,(json *)&s1.field_0x50);
  argo::json::json((json *)&s2.field_0x50,"a");
  argo::json::json((json *)&s3.field_0x50,"a");
  argo::json::json((json *)local_330,"b");
  std::operator<<((ostream *)jlog,"testing string comparisons\n");
  test_comparison_operators_same
            ((json *)&d2.field_0x50,(json *)&d3.field_0x50,(json *)&s1.field_0x50);
  std::operator<<((ostream *)jlog,"testing int/double comparisons\n");
  test_comparison_operators_same((json *)&i2.field_0x50,(json *)local_b8,(json *)&d1.field_0x50);
  test_comparison_operators_same((json *)&i2.field_0x50,(json *)local_b8,(json *)&s1.field_0x50);
  test_comparison_operators_same
            ((json *)&i2.field_0x50,(json *)&d3.field_0x50,(json *)&d1.field_0x50);
  test_comparison_operators_same
            ((json *)&i2.field_0x50,(json *)&d3.field_0x50,(json *)&s1.field_0x50);
  test_comparison_operators_same((json *)&d2.field_0x50,(json *)local_b8,(json *)&d1.field_0x50);
  test_comparison_operators_same((json *)&d2.field_0x50,(json *)local_b8,(json *)&s1.field_0x50);
  test_comparison_operators_same
            ((json *)&d2.field_0x50,(json *)&d3.field_0x50,(json *)&d1.field_0x50);
  test_comparison_operators_same
            ((json *)&d2.field_0x50,(json *)&d3.field_0x50,(json *)&s1.field_0x50);
  argo::json::~json((json *)local_330);
  argo::json::~json((json *)&s3.field_0x50);
  argo::json::~json((json *)&s2.field_0x50);
  argo::json::~json((json *)&s1.field_0x50);
  argo::json::~json((json *)&d3.field_0x50);
  argo::json::~json((json *)&d2.field_0x50);
  argo::json::~json((json *)&d1.field_0x50);
  argo::json::~json((json *)local_b8);
  argo::json::~json((json *)&i2.field_0x50);
  return;
}

Assistant:

void test_comparison_operators()
{
    // test < > <= >= == != where both sides are the same type

    json i1(1);
    json i2(1);
    json i3(2);
    jlog << "testing int comparisons\n";
    test_comparison_operators_same(i1, i2, i3);
    json d1(1.0);
    json d2(1.0);
    json d3(2.0);
    jlog << "testing double comparisons\n";
    test_comparison_operators_same(d1, d2, d3);
    json s1("a");
    json s2("a");
    json s3("b");
    jlog << "testing string comparisons\n";
    test_comparison_operators_same(d1, d2, d3);

    // test < > <= >= == != where one side is an int and the other is a double
    jlog << "testing int/double comparisons\n";
    test_comparison_operators_same(i1, i2, i3);
    test_comparison_operators_same(i1, i2, d3);
    test_comparison_operators_same(i1, d2, i3);
    test_comparison_operators_same(i1, d2, d3);
    test_comparison_operators_same(d1, i2, i3);
    test_comparison_operators_same(d1, i2, d3);
    test_comparison_operators_same(d1, d2, i3);
    test_comparison_operators_same(d1, d2, d3);
}